

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSearchPath.cpp
# Opt level: O0

string * __thiscall MinVR::VRSearchPath::getFullFilenames(VRSearchPath *this,string *desiredFile)

{
  bool bVar1;
  reference pbVar2;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDX;
  undefined8 *in_RSI;
  string *in_RDI;
  const_iterator it;
  string out;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff38;
  string *psVar3;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__rhs;
  string *__lhs;
  string local_88 [32];
  string local_68 [32];
  _Self local_48;
  _Self local_40;
  string local_38 [32];
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  
  __lhs = in_RDI;
  local_18 = in_RDX;
  std::__cxx11::string::string(local_38);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_ffffffffffffff38);
  while( true ) {
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_ffffffffffffff38);
    bVar1 = std::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    __rhs = local_18;
    pbVar2 = std::
             _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_18);
    (**(code **)*in_RSI)(local_88,in_RSI,__rhs,pbVar2);
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::string::operator+=(local_38,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_40,0);
  }
  psVar3 = local_38;
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)__lhs,(ulong)psVar3);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string VRSearchPath::getFullFilenames(const std::string &desiredFile) const {

    std::string out;
    for (std::list<std::string>::const_iterator it = _searchPath.begin();
         it != _searchPath.end(); it++)
        out += _selectFile(desiredFile, (*it)) + ":";

    return out.substr(0, out.length() - 1);
}